

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

QString * __thiscall
QCoreApplicationPrivate::appName(QString *__return_storage_ptr__,QCoreApplicationPrivate *this)

{
  char *pcVar1;
  char *pcVar2;
  storage_type *in_RCX;
  char *pcVar3;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pcVar1 = *this->argv;
  if (pcVar1 != (char *)0x0) {
    pcVar2 = strrchr(pcVar1,0x2f);
    pcVar3 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar3 = pcVar1;
    }
    this_00 = (QString *)0xffffffffffffffff;
    do {
      pcVar1 = pcVar3 + 1 + (long)this_00;
      this_00 = (QString *)((long)&(this_00->d).d + 1);
    } while (*pcVar1 != '\0');
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)pcVar3;
    QString::fromLocal8Bit(&local_38,this_00,ba);
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    (__return_storage_ptr__->d).size = local_38.d.size;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCoreApplicationPrivate::appName() const
{
    QString applicationName;
#ifdef Q_OS_DARWIN
    applicationName = infoDictionaryStringProperty(QStringLiteral("CFBundleName"));
#endif
    if (applicationName.isEmpty() && argv[0]) {
        char *p = strrchr(argv[0], '/');
        applicationName = QString::fromLocal8Bit(p ? p + 1 : argv[0]);
    }

    return applicationName;
}